

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

QPDFObjectHandle __thiscall
QPDF::readObjectInStream(QPDF *this,OffsetBuffer *input,int stream_id,int obj_id)

{
  int iVar1;
  pointer pMVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  qpdf_offset_t __val;
  undefined4 in_register_00000014;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_R8D;
  QPDFObjectHandle QVar4;
  allocator<char> local_201;
  string local_200;
  string local_1e0;
  string local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  QPDFExc local_d0;
  type_conflict2 *local_50;
  type_conflict2 *empty;
  type *object;
  int local_28;
  int local_24;
  int obj_id_local;
  int stream_id_local;
  OffsetBuffer *input_local;
  QPDF *this_local;
  
  local_28 = in_R8D;
  local_24 = obj_id;
  _obj_id_local = (OffsetBuffer *)CONCAT44(in_register_00000014,stream_id);
  input_local = input;
  this_local = this;
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                     ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)input);
  QPDFParser::parse((pair<QPDFObjectHandle,_bool> *)&object,
                    (OffsetBuffer *)CONCAT44(in_register_00000014,stream_id),obj_id,in_R8D,
                    &pMVar2->tokenizer,(QPDF *)input);
  empty = (type_conflict2 *)
          std::get<0ul,QPDFObjectHandle,bool>((pair<QPDFObjectHandle,_bool> *)&object);
  local_50 = std::get<1ul,QPDFObjectHandle,bool>((pair<QPDFObjectHandle,_bool> *)&object);
  if ((*local_50 & 1U) != 0) {
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)input);
    peVar3 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pMVar2->file);
    iVar1 = (*peVar3->_vptr_InputSource[3])();
    std::operator+(&local_110,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var,iVar1)," object stream ");
    std::__cxx11::to_string(&local_140,local_24);
    std::operator+(&local_f0,&local_110,&local_140);
    std::__cxx11::to_string(&local_1c0,local_28);
    std::operator+(&local_1a0,"object ",&local_1c0);
    std::operator+(&local_180,&local_1a0," 0, offset ");
    __val = InputSource::getLastOffset(&_obj_id_local->super_InputSource);
    std::__cxx11::to_string(&local_1e0,__val);
    std::operator+(&local_160,&local_180,&local_1e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,"empty object treated as null",&local_201);
    QPDFExc::QPDFExc(&local_d0,qpdf_e_damaged_pdf,&local_f0,&local_160,0,&local_200);
    warn((QPDF *)input,&local_d0);
    QPDFExc::~QPDFExc(&local_d0);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_110);
  }
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this,(QPDFObjectHandle *)empty);
  std::pair<QPDFObjectHandle,_bool>::~pair((pair<QPDFObjectHandle,_bool> *)&object);
  QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDF::readObjectInStream(is::OffsetBuffer& input, int stream_id, int obj_id)
{
    auto [object, empty] = QPDFParser::parse(input, stream_id, obj_id, m->tokenizer, *this);
    if (empty) {
        // Nothing in the PDF spec appears to allow empty objects, but they have been encountered in
        // actual PDF files and Adobe Reader appears to ignore them.
        warn(QPDFExc(
            qpdf_e_damaged_pdf,
            m->file->getName() + " object stream " + std::to_string(stream_id),
            +"object " + std::to_string(obj_id) + " 0, offset " +
                std::to_string(input.getLastOffset()),
            0,
            "empty object treated as null"));
    }
    return object;
}